

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::ConversionExpr::printLeft(ConversionExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  Node::print(this->Type,S);
  R_00.Last = "";
  R_00.First = ")(";
  OutputStream::operator+=(S,R_00);
  NodeArray::printWithComma(&this->Expressions,S);
  R_01.Last = "";
  R_01.First = ")";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Type->print(S);
    S += ")(";
    Expressions.printWithComma(S);
    S += ")";
  }